

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O3

void __thiscall
streams_tests::streams_buffered_file_rand::test_method(streams_buffered_file_rand *this)

{
  long lVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  _func_int *p_Var5;
  uint64_t uVar6;
  uint64_t in_RCX;
  size_t __nbytes;
  byte bVar7;
  ulong uVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  uint64_t maxval;
  byte *pbVar11;
  FastRandomContext *this_00;
  uint8_t i_1;
  bool bVar12;
  long lVar13;
  long in_FS_OFFSET;
  bool bVar14;
  readonly_property<bool> rVar15;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar16;
  _func_int *local_308;
  ulong local_300;
  int local_2f4;
  uint64_t local_2f0;
  _func_int *local_2e8;
  uint64_t local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  uint8_t i;
  undefined7 uStack_267;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  size_t currentPos;
  BufferedFile bf;
  AutoFile local_128;
  size_t *local_108;
  assertion_result local_100;
  size_t **local_e8;
  byte *local_e0;
  uint8_t obj;
  bool local_d0;
  undefined1 *local_c8;
  byte **local_c0;
  char *local_b8;
  char *local_b0;
  assertion_result local_a8;
  uint8_t a [1];
  byte abStack_8f [7];
  path local_88;
  path streams_test_filename;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,ZEROS);
  ArgsManager::GetDataDir
            ((path *)(abStack_8f + 7),&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append((path *)(abStack_8f + 7),0x10,"streams_test_tmp");
  std::filesystem::__cxx11::path::path(&streams_test_filename.super_path,(path *)(abStack_8f + 7));
  std::filesystem::__cxx11::path::~path((path *)(abStack_8f + 7));
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  iVar4 = 0;
  do {
    local_128.m_file = (FILE *)fsbridge::fopen((char *)&streams_test_filename,"w+b");
    local_128.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f4 = iVar4;
    do {
      p_Var5 = (_func_int *)
               RandomMixin<FastRandomContext>::randbits
                         (&this_00->super_RandomMixin<FastRandomContext>,8);
    } while ((_func_int *)0xff < p_Var5);
    local_308 = p_Var5;
    if (p_Var5 != (_func_int *)0x0) {
      bVar7 = 0;
      do {
        bf.m_src._0_1_ = bVar7;
        AutoFile::write(&local_128,(int)&local_308 + 0x1a0,(void *)0x1,in_RCX);
        bVar7 = bVar7 + 1;
      } while (bVar7 < (byte)local_308);
    }
    rewind((FILE *)local_128.m_file);
    do {
      uVar6 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,9);
    } while (299 < uVar6);
    if (uVar6 == 0) {
      uVar3 = 0x40;
    }
    else {
      lVar13 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      uVar3 = (uint)lVar13 ^ 0x3f;
    }
    do {
      in_RCX = RandomMixin<FastRandomContext>::randbits
                         (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar3);
    } while (uVar6 < in_RCX);
    local_2f0 = in_RCX;
    BufferedFile::BufferedFile(&bf,&local_128,uVar6 + 1,in_RCX);
    currentPos = 0;
    if (local_308 != (_func_int *)0x0) {
      local_2e8 = local_308 + -1;
      in_RCX = 0;
      local_300 = 0;
      do {
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        _cVar16 = 0x64a0c6;
        file.m_end = (iterator)0x1cb;
        file.m_begin = (iterator)&local_180;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        local_2e0 = in_RCX;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_190,
                   msg);
        rVar15.super_class_property<bool>.value = (class_property<bool>)true;
        if (bf.m_read_pos == bf.nSrcPos) {
          _cVar16 = 0x64a0ea;
          iVar4 = feof(*(FILE **)CONCAT71(bf.m_src._1_7_,(byte)bf.m_src));
          rVar15.super_class_property<bool>.value = (class_property<bool>)(iVar4 == 0);
        }
        local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             (readonly_property<bool>)rVar15.super_class_property<bool>.value;
        local_100.m_message.px = (element_type *)0x0;
        local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_1e0._0_8_ = "!bf.eof()";
        local_1e0._8_8_ = "";
        local_d0 = false;
        _obj = &PTR__lazy_ostream_013ae1c8;
        local_c8 = boost::unit_test::lazy_ostream::inst;
        local_c0 = (byte **)local_1e0;
        local_1a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
        ;
        local_198 = "";
        pvVar9 = (iterator)0x1;
        pvVar10 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_100,(lazy_ostream *)&obj,1,0,WARN,_cVar16,(size_t)&local_1a0,0x1cb);
        boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
        local_1b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
        ;
        local_1a8 = "";
        local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_00.m_end = (iterator)0x1cc;
        file_00.m_begin = (iterator)&local_1b0;
        msg_00.m_end = pvVar10;
        msg_00.m_begin = pvVar9;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c0
                   ,msg_00);
        local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffffffffff00;
        local_1e0._0_8_ = &PTR__lazy_ostream_013ae088;
        local_1d0 = boost::unit_test::lazy_ostream::inst;
        local_1c8 = "";
        _a = (_func_int *)bf.m_read_pos;
        local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(bf.m_read_pos == currentPos);
        local_a8.m_message.px = (element_type *)0x0;
        local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
        ;
        local_b0 = "";
        local_e0 = a;
        local_d0 = false;
        _obj = &PTR__lazy_ostream_013ae0c8;
        local_c8 = boost::unit_test::lazy_ostream::inst;
        local_c0 = &local_e0;
        local_108 = &currentPos;
        local_100.m_message.px =
             (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
        local_100._0_8_ = &PTR__lazy_ostream_013ae0c8;
        local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_e8 = &local_108;
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  (&local_a8,(lazy_ostream *)local_1e0,1,2,REQUIRE,0xf466bc,(size_t)&local_b8,0x1cc,
                   &obj,"currentPos",&local_100);
        boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
switchD_0064a366_default:
        uVar6 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,3);
        sVar2 = currentPos;
        switch(uVar6) {
        case 0:
          p_Var5 = (_func_int *)(currentPos + 1);
          if (p_Var5 <= local_308) {
            if (bf.m_read_pos <= p_Var5) {
              bf.nReadLimit = (uint64_t)p_Var5;
            }
            BufferedFile::read(&bf,(int)a,(void *)0x1,(size_t)p_Var5);
            local_1f0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
            ;
            local_1e8 = "";
            local_200 = &boost::unit_test::basic_cstring<char_const>::null;
            local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_01.m_end = (iterator)0x1da;
            file_01.m_begin = (iterator)&local_1f0;
            msg_01.m_end = in_R9;
            msg_01.m_begin = in_R8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                       (size_t)&local_200,msg_01);
            local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffffffffff00;
            local_1e0._0_8_ = &PTR__lazy_ostream_013ae088;
            local_1d0 = boost::unit_test::lazy_ostream::inst;
            local_1c8 = "";
            local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(currentPos == ((ulong)_a & 0xff));
            local_a8.m_message.px = (element_type *)0x0;
            local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_b8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
            ;
            local_b0 = "";
            local_e0 = a;
            local_d0 = false;
            _obj = &PTR__lazy_ostream_013aee50;
            local_c8 = boost::unit_test::lazy_ostream::inst;
            local_c0 = &local_e0;
            local_108 = &currentPos;
            local_100.m_message.px =
                 (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
            local_100._0_8_ = &PTR__lazy_ostream_013ae0c8;
            local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_e8 = &local_108;
            in_R8 = (iterator)0x1;
            in_R9 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      (&local_a8,(lazy_ostream *)local_1e0,1,2,REQUIRE,0xf4686d,(size_t)&local_b8,
                       0x1da,&obj,"currentPos",&local_100);
            goto LAB_0064a95a;
          }
          goto LAB_0064b11f;
        case 1:
          p_Var5 = (_func_int *)(currentPos + 2);
          if (local_308 < p_Var5) goto LAB_0064b11f;
          if (bf.m_read_pos <= p_Var5) {
            bf.nReadLimit = (uint64_t)p_Var5;
          }
          pbVar11 = a;
          BufferedFile::read(&bf,(int)pbVar11,(void *)0x2,(size_t)p_Var5);
          bVar14 = true;
          do {
            bVar12 = bVar14;
            local_210 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
            ;
            local_208 = "";
            local_220 = &boost::unit_test::basic_cstring<char_const>::null;
            local_218 = &boost::unit_test::basic_cstring<char_const>::null;
            file_05.m_end = (iterator)0x1e6;
            file_05.m_begin = (iterator)&local_210;
            msg_05.m_end = in_R9;
            msg_05.m_begin = in_R8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                       (size_t)&local_220,msg_05);
            local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffffffffff00;
            local_1e0._0_8_ = &PTR__lazy_ostream_013ae088;
            local_1d0 = boost::unit_test::lazy_ostream::inst;
            local_1c8 = "";
            local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(currentPos == *pbVar11);
            local_a8.m_message.px = (element_type *)0x0;
            local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_b8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
            ;
            local_b0 = "";
            local_d0 = false;
            _obj = &PTR__lazy_ostream_013aee50;
            local_c8 = boost::unit_test::lazy_ostream::inst;
            local_c0 = &local_e0;
            local_108 = &currentPos;
            local_100.m_message.px =
                 (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
            local_100._0_8_ = &PTR__lazy_ostream_013ae0c8;
            local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_e8 = &local_108;
            in_R8 = (iterator)0x1;
            in_R9 = (iterator)0x2;
            local_e0 = pbVar11;
            boost::test_tools::tt_detail::report_assertion
                      (&local_a8,(lazy_ostream *)local_1e0,1,2,REQUIRE,0xf4686d,(size_t)&local_b8,
                       0x1e6,&obj,"currentPos",&local_100);
            boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
            currentPos = currentPos + 1;
            pbVar11 = abStack_8f;
            bVar14 = false;
          } while (bVar12);
          break;
        case 2:
          p_Var5 = (_func_int *)(currentPos + 5);
          if (local_308 < p_Var5) goto LAB_0064b11f;
          if (bf.m_read_pos <= p_Var5) {
            bf.nReadLimit = (uint64_t)p_Var5;
          }
          BufferedFile::read(&bf,(int)a,(void *)0x5,(size_t)p_Var5);
          lVar13 = 0;
          do {
            local_230 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
            ;
            local_228 = "";
            local_240 = &boost::unit_test::basic_cstring<char_const>::null;
            local_238 = &boost::unit_test::basic_cstring<char_const>::null;
            file_04.m_end = (iterator)0x1f2;
            file_04.m_begin = (iterator)&local_230;
            msg_04.m_end = in_R9;
            msg_04.m_begin = in_R8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                       (size_t)&local_240,msg_04);
            local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffffffffff00;
            local_1e0._0_8_ = &PTR__lazy_ostream_013ae088;
            local_1d0 = boost::unit_test::lazy_ostream::inst;
            local_1c8 = "";
            local_e0 = a + lVar13;
            local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(currentPos == *local_e0);
            local_a8.m_message.px = (element_type *)0x0;
            local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_b8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
            ;
            local_b0 = "";
            local_d0 = false;
            _obj = &PTR__lazy_ostream_013aee50;
            local_c8 = boost::unit_test::lazy_ostream::inst;
            local_c0 = &local_e0;
            local_108 = &currentPos;
            local_100.m_message.px =
                 (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
            local_100._0_8_ = &PTR__lazy_ostream_013ae0c8;
            local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_e8 = &local_108;
            in_R8 = (iterator)0x1;
            in_R9 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      (&local_a8,(lazy_ostream *)local_1e0,1,2,REQUIRE,0xf4686d,(size_t)&local_b8,
                       0x1f2,&obj,"currentPos",&local_100);
            boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
            currentPos = currentPos + 1;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 5);
          break;
        case 3:
          do {
            uVar6 = RandomMixin<FastRandomContext>::randbits
                              (&this_00->super_RandomMixin<FastRandomContext>,3);
          } while (4 < uVar6);
          p_Var5 = (_func_int *)(currentPos + uVar6);
          if (local_308 < p_Var5) goto LAB_0064b11f;
          if (bf.m_read_pos <= p_Var5) {
            bf.nReadLimit = (uint64_t)p_Var5;
          }
          BufferedFile::SkipTo(&bf,(uint64_t)p_Var5);
          currentPos = uVar6 + currentPos;
          break;
        case 4:
          do {
            uVar6 = RandomMixin<FastRandomContext>::randbits
                              (&this_00->super_RandomMixin<FastRandomContext>,3);
          } while (7 < uVar6);
          _a = (_func_int *)(uVar6 + sVar2);
          if (local_308 <= (_func_int *)(uVar6 + sVar2)) {
            _a = local_2e8;
          }
          BufferedFile::FindByte(&bf,(byte)_a);
          local_250 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_248 = "";
          local_260 = &boost::unit_test::basic_cstring<char_const>::null;
          local_258 = &boost::unit_test::basic_cstring<char_const>::null;
          file_02.m_end = (iterator)0x208;
          file_02.m_begin = (iterator)&local_250;
          msg_02.m_end = in_R9;
          msg_02.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                     (size_t)&local_260,msg_02);
          local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffffffffff00;
          local_1e0._0_8_ = &PTR__lazy_ostream_013ae088;
          local_1d0 = boost::unit_test::lazy_ostream::inst;
          local_1c8 = "";
          _i = bf.m_read_pos;
          local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)((_func_int *)bf.m_read_pos == _a);
          local_a8.m_message.px = (element_type *)0x0;
          local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_b0 = "";
          local_e0 = &i;
          local_d0 = false;
          _obj = &PTR__lazy_ostream_013ae0c8;
          local_c8 = boost::unit_test::lazy_ostream::inst;
          local_c0 = &local_e0;
          local_108 = (size_t *)a;
          local_100.m_message.px =
               (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
          local_100._0_8_ = &PTR__lazy_ostream_013ae0c8;
          local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_e8 = &local_108;
          pvVar9 = (iterator)0x1;
          pvVar10 = (iterator)0x2;
          __nbytes = 0x208;
          boost::test_tools::tt_detail::report_assertion
                    (&local_a8,(lazy_ostream *)local_1e0,1,2,REQUIRE,0xf466bc,(size_t)&local_b8,
                     0x208,&obj,"find",&local_100);
          boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
          currentPos = (size_t)_a;
          if (bf.m_read_pos <= _a + 1) {
            bf.nReadLimit = (uint64_t)(_a + 1);
          }
          BufferedFile::read(&bf,(int)&obj,(void *)0x1,__nbytes);
          _i = CONCAT71(uStack_267,obj);
          local_278 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_270 = "";
          local_288 = &boost::unit_test::basic_cstring<char_const>::null;
          local_280 = &boost::unit_test::basic_cstring<char_const>::null;
          file_03.m_end = (iterator)0x20e;
          file_03.m_begin = (iterator)&local_278;
          msg_03.m_end = pvVar10;
          msg_03.m_begin = pvVar9;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_288,msg_03);
          local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffffffffff00;
          local_1e0._0_8_ = &PTR__lazy_ostream_013ae088;
          local_1d0 = boost::unit_test::lazy_ostream::inst;
          local_1c8 = "";
          local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(currentPos == (_i & 0xff));
          local_a8.m_message.px = (element_type *)0x0;
          local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_b0 = "";
          local_e0 = &i;
          local_d0 = false;
          _obj = &PTR__lazy_ostream_013aee50;
          local_c8 = boost::unit_test::lazy_ostream::inst;
          local_c0 = &local_e0;
          local_108 = &currentPos;
          local_100.m_message.px =
               (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
          local_100._0_8_ = &PTR__lazy_ostream_013ae0c8;
          local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_e8 = &local_108;
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_a8,(lazy_ostream *)local_1e0,1,2,REQUIRE,0xeb3827,(size_t)&local_b8,
                     0x20e,&obj,"currentPos",&local_100);
LAB_0064a95a:
          boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
          currentPos = currentPos + 1;
          break;
        case 5:
          uVar8 = local_300 + 3;
          if (uVar8 == 0) {
            uVar3 = 0x40;
          }
          else {
            lVar13 = 0x3f;
            if (uVar8 != 0) {
              for (; uVar8 >> lVar13 == 0; lVar13 = lVar13 + -1) {
              }
            }
            uVar3 = (uint)lVar13 ^ 0x3f;
          }
          do {
            uVar6 = RandomMixin<FastRandomContext>::randbits
                              (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar3);
          } while (uVar8 < uVar6);
          currentPos = uVar6;
          if (uVar6 > bf.nSrcPos) {
            currentPos = bf.nSrcPos;
          }
          bVar14 = bf.nSrcPos <=
                   ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_start) + uVar6;
          if (!bVar14) {
            currentPos = bf.nSrcPos -
                         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                               _M_impl.super__Vector_impl_data._M_start);
          }
          _a = (_func_int *)CONCAT71(abStack_8f,bVar14 && uVar6 <= bf.nSrcPos);
          local_298 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_290 = "";
          local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = (iterator)0x21a;
          file_06.m_begin = (iterator)&local_298;
          msg_06.m_end = in_R9;
          msg_06.m_begin = in_R8;
          bf.m_read_pos = currentPos;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_2a8,msg_06);
          local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffffffffff00;
          local_1e0._0_8_ = &PTR__lazy_ostream_013ae088;
          local_1d0 = boost::unit_test::lazy_ostream::inst;
          _i = CONCAT71(uStack_267,currentPos == uVar6);
          local_1c8 = "";
          local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)((bool)a[0] == (currentPos == uVar6));
          local_a8.m_message.px = (element_type *)0x0;
          local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_b0 = "";
          local_e0 = a;
          local_d0 = false;
          _obj = &PTR__lazy_ostream_013ae3e8;
          local_c8 = boost::unit_test::lazy_ostream::inst;
          local_c0 = &local_e0;
          local_108 = (size_t *)&i;
          local_100.m_message.px =
               (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
          local_100._0_8_ = &PTR__lazy_ostream_013ae3e8;
          local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_e8 = &local_108;
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_a8,(lazy_ostream *)local_1e0,1,2,REQUIRE,0xf46877,(size_t)&local_b8,
                     0x21a,&obj,"currentPos == requestPos",&local_100);
          boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
          if (((local_300 - local_2f0 <= uVar6) && (local_2f0 < local_300)) && (uVar6 <= local_300))
          {
            local_2b8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
            ;
            local_2b0 = "";
            local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar16 = 0x64b044;
            file_07.m_end = (iterator)0x220;
            file_07.m_begin = (iterator)&local_2b8;
            msg_07.m_end = in_R9;
            msg_07.m_begin = in_R8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                       (size_t)&local_2c8,msg_07);
            local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(readonly_property<bool>)a[0];
            local_100.m_message.px = (element_type *)0x0;
            local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_1e0._0_8_ = "okay";
            local_1e0._8_8_ = "";
            local_d0 = false;
            _obj = &PTR__lazy_ostream_013ae1c8;
            local_c8 = boost::unit_test::lazy_ostream::inst;
            local_c0 = (byte **)local_1e0;
            local_2d8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
            ;
            local_2d0 = "";
            in_R8 = (iterator)0x1;
            in_R9 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (&local_100,(lazy_ostream *)&obj,1,0,WARN,_cVar16,(size_t)&local_2d8,0x220);
            boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
          }
          break;
        default:
          goto switchD_0064a366_default;
        }
        if (local_300 <= currentPos) {
          local_300 = currentPos;
        }
LAB_0064b11f:
        in_RCX = local_2e0;
      } while (((uint)local_2e0 < 99) &&
              (in_RCX = (uint64_t)((uint)local_2e0 + 1), currentPos < local_308));
    }
    iVar4 = local_2f4;
    if (bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    AutoFile::~AutoFile(&local_128);
    iVar4 = iVar4 + 1;
    if (iVar4 == 0x32) {
      std::filesystem::remove((path *)&streams_test_filename);
      std::filesystem::__cxx11::path::~path(&streams_test_filename.super_path);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_buffered_file_rand)
{
    // Make this test deterministic.
    SeedRandomForTest(SeedRand::ZEROS);

    fs::path streams_test_filename = m_args.GetDataDirBase() / "streams_test_tmp";
    for (int rep = 0; rep < 50; ++rep) {
        AutoFile file{fsbridge::fopen(streams_test_filename, "w+b")};
        size_t fileSize = m_rng.randrange(256);
        for (uint8_t i = 0; i < fileSize; ++i) {
            file << i;
        }
        std::rewind(file.Get());

        size_t bufSize = m_rng.randrange(300) + 1;
        size_t rewindSize = m_rng.randrange(bufSize);
        BufferedFile bf{file, bufSize, rewindSize};
        size_t currentPos = 0;
        size_t maxPos = 0;
        for (int step = 0; step < 100; ++step) {
            if (currentPos >= fileSize)
                break;

            // We haven't read to the end of the file yet.
            BOOST_CHECK(!bf.eof());
            BOOST_CHECK_EQUAL(bf.GetPos(), currentPos);

            // Pretend the file consists of a series of objects of varying
            // sizes; the boundaries of the objects can interact arbitrarily
            // with the CBufferFile's internal buffer. These first three
            // cases simulate objects of various sizes (1, 2, 5 bytes).
            switch (m_rng.randrange(6)) {
            case 0: {
                uint8_t a[1];
                if (currentPos + 1 > fileSize)
                    continue;
                bf.SetLimit(currentPos + 1);
                bf >> a;
                for (uint8_t i = 0; i < 1; ++i) {
                    BOOST_CHECK_EQUAL(a[i], currentPos);
                    currentPos++;
                }
                break;
            }
            case 1: {
                uint8_t a[2];
                if (currentPos + 2 > fileSize)
                    continue;
                bf.SetLimit(currentPos + 2);
                bf >> a;
                for (uint8_t i = 0; i < 2; ++i) {
                    BOOST_CHECK_EQUAL(a[i], currentPos);
                    currentPos++;
                }
                break;
            }
            case 2: {
                uint8_t a[5];
                if (currentPos + 5 > fileSize)
                    continue;
                bf.SetLimit(currentPos + 5);
                bf >> a;
                for (uint8_t i = 0; i < 5; ++i) {
                    BOOST_CHECK_EQUAL(a[i], currentPos);
                    currentPos++;
                }
                break;
            }
            case 3: {
                // SkipTo is similar to the "read" cases above, except
                // we don't receive the data.
                size_t skip_length{static_cast<size_t>(m_rng.randrange(5))};
                if (currentPos + skip_length > fileSize) continue;
                bf.SetLimit(currentPos + skip_length);
                bf.SkipTo(currentPos + skip_length);
                currentPos += skip_length;
                break;
            }
            case 4: {
                // Find a byte value (that is at or ahead of the current position).
                size_t find = currentPos + m_rng.randrange(8);
                if (find >= fileSize)
                    find = fileSize - 1;
                bf.FindByte(std::byte(find));
                // The value at each offset is the offset.
                BOOST_CHECK_EQUAL(bf.GetPos(), find);
                currentPos = find;

                bf.SetLimit(currentPos + 1);
                uint8_t i;
                bf >> i;
                BOOST_CHECK_EQUAL(i, currentPos);
                currentPos++;
                break;
            }
            case 5: {
                size_t requestPos = m_rng.randrange(maxPos + 4);
                bool okay = bf.SetPos(requestPos);
                // The new position may differ from the requested position
                // because we may not be able to rewind beyond the rewind
                // window, and we may not be able to move forward beyond the
                // farthest position we've reached so far.
                currentPos = bf.GetPos();
                BOOST_CHECK_EQUAL(okay, currentPos == requestPos);
                // Check that we can position within the rewind window.
                if (requestPos <= maxPos &&
                    maxPos > rewindSize &&
                    requestPos >= maxPos - rewindSize) {
                    // We requested a position within the rewind window.
                    BOOST_CHECK(okay);
                }
                break;
            }
            }
            if (maxPos < currentPos)
                maxPos = currentPos;
        }
    }
    fs::remove(streams_test_filename);
}